

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-rbtree.c
# Opt level: O2

int val_cmp(RBTREE_NODE *node1,RBTREE_NODE *node2)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*(int *)&node2[-1].r <= *(int *)&node1[-1].r) {
    uVar1 = (uint)(*(int *)&node2[-1].r < *(int *)&node1[-1].r);
  }
  return uVar1;
}

Assistant:

static int
val_cmp(const RBTREE_NODE* node1, const RBTREE_NODE* node2)
{
    const VAL* val1 = RBTREE_DATA(node1, VAL, the_node);
    const VAL* val2 = RBTREE_DATA(node2, VAL, the_node);

    if(val1->x < val2->x)
        return -1;
    if(val1->x > val2->x)
        return +1;
    return 0;
}